

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_area_ratio_to_parcor_coefficients.cc
# Opt level: O1

bool __thiscall
sptk::LogAreaRatioToParcorCoefficients::Run
          (LogAreaRatioToParcorCoefficients *this,
          vector<double,_std::allocator<double>_> *log_area_ratio,
          vector<double,_std::allocator<double>_> *parcor_coefficients)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  size_type __new_size;
  double *pdVar4;
  double dVar5;
  
  if (this->is_valid_ == true) {
    bVar3 = false;
    if ((parcor_coefficients != (vector<double,_std::allocator<double>_> *)0x0) &&
       (__new_size = (long)this->num_order_ + 1, bVar3 = false,
       (long)(log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      if ((long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(parcor_coefficients,__new_size);
      }
      pdVar1 = (log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar4 = *pdVar1;
      bVar3 = true;
      if (this->num_order_ != 0) {
        pdVar2 = (log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        while (pdVar1 = pdVar1 + 1, pdVar1 != pdVar2) {
          pdVar4 = pdVar4 + 1;
          dVar5 = tanh(*pdVar1 * 0.5);
          *pdVar4 = dVar5;
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool LogAreaRatioToParcorCoefficients::Run(
    const std::vector<double>& log_area_ratio,
    std::vector<double>* parcor_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ || log_area_ratio.size() != static_cast<std::size_t>(length) ||
      NULL == parcor_coefficients) {
    return false;
  }

  // Prepare memories.
  if (parcor_coefficients->size() != static_cast<std::size_t>(length)) {
    parcor_coefficients->resize(length);
  }

  // Copy gain.
  (*parcor_coefficients)[0] = log_area_ratio[0];
  if (0 == num_order_) {
    return true;
  }

  std::transform(log_area_ratio.begin() + 1, log_area_ratio.end(),
                 parcor_coefficients->begin() + 1,
                 [](double g) { return std::tanh(0.5 * g); });

  return true;
}